

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Promise<kj::HttpClient::Response> * __thiscall
kj::_::NullableValue<kj::Promise<kj::HttpClient::Response>>::
emplace<kj::Promise<kj::HttpClient::Response>>
          (NullableValue<kj::Promise<kj::HttpClient::Response>> *this,
          Promise<kj::HttpClient::Response> *params)

{
  Promise<kj::HttpClient::Response> *params_00;
  Promise<kj::HttpClient::Response> *params_local;
  NullableValue<kj::Promise<kj::HttpClient::Response>_> *this_local;
  
  if (((byte)*this & 1) != 0) {
    *this = (NullableValue<kj::Promise<kj::HttpClient::Response>>)0x0;
    dtor<kj::Promise<kj::HttpClient::Response>>((Promise<kj::HttpClient::Response> *)(this + 8));
  }
  params_00 = fwd<kj::Promise<kj::HttpClient::Response>>(params);
  ctor<kj::Promise<kj::HttpClient::Response>,kj::Promise<kj::HttpClient::Response>>
            ((Promise<kj::HttpClient::Response> *)(this + 8),params_00);
  *this = (NullableValue<kj::Promise<kj::HttpClient::Response>>)0x1;
  return (Promise<kj::HttpClient::Response> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }